

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O2

string * get_process_owner(string *__return_storage_ptr__,string *pid)

{
  __uid_t __uid;
  long lVar1;
  passwd *ppVar2;
  allocator local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  ifstream fin;
  
  std::ifstream::ifstream(&fin);
  std::operator+(&local_280,"/proc/",pid);
  std::operator+(&line,&local_280,"/status");
  std::ifstream::open((string *)&fin,(_Ios_Openmode)&line);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&local_280);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    lVar1 = std::__cxx11::string::find((char *)&line,0x119285);
    if (lVar1 != -1) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&fin,(string *)&line);
  }
  std::ifstream::close();
  std::__cxx11::string::string((string *)&local_280,"\\s+",&local_281);
  split(&info,&line,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  __uid = std::__cxx11::stoi(info.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
  ppVar2 = getpwuid(__uid);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,ppVar2->pw_name,(allocator *)&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&info);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&fin);
  return __return_storage_ptr__;
}

Assistant:

std::string get_process_owner(const std::string &pid) {
    std::ifstream fin;
    fin.open("/proc/" + pid + "/status");
    std::string line;
    while (line.find("Uid") == std::string::npos) {
        getline(fin, line);
    }
    fin.close();

    std::vector<std::string> info = split(line, "\\s+");
    return getpwuid(stoi(info[2]))->pw_name;
}